

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *in,QDateTime *dateTime)

{
  int iVar1;
  Data DVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  long in_FS_OFFSET;
  qint32 offset;
  quint32 ds;
  qint8 ts;
  Data local_50;
  Data local_48;
  Data local_40;
  byte local_31;
  QDate local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.jd = -0x8000000000000000;
  local_31 = 0;
  local_40 = (Data)0x1;
  iVar1 = in->ver;
  if (iVar1 < 0xf) {
    if (iVar1 == 0xd) {
      operator>>(in,&local_30);
      local_48._0_4_ = 0xaaaaaaaa;
      QDataStream::operator>>(in,(qint32 *)&local_48);
      iVar1 = in->ver;
      uVar4 = local_48._0_4_;
      QDataStream::operator>>(in,(qint8 *)&local_31);
      uVar3 = -(uint)(uVar4 == 0) | uVar4;
      if (6 < iVar1) {
        uVar3 = uVar4;
      }
      local_50 = (Data)0x2;
      QDateTime::QDateTime
                ((QDateTime *)&local_48.data,local_30,(QTime)uVar3,(QTimeZone *)&local_50.s,
                 LegacyBehavior);
      DVar2.data = *(ShortData *)&dateTime->d;
      dateTime->d = local_48;
      local_48.data = DVar2.data;
      QDateTime::~QDateTime((QDateTime *)&local_48.data);
      QTimeZone::~QTimeZone((QTimeZone *)&local_50.s);
      if (local_31 != 0) goto LAB_0034c597;
      QDateTime::toTimeZone((QDateTime *)&local_48.data,(QTimeZone *)dateTime);
    }
    else if (iVar1 < 7) {
      operator>>(in,&local_30);
      local_48._0_4_ = 0xaaaaaaaa;
      QDataStream::operator>>(in,(qint32 *)&local_48);
      uVar3 = -(uint)(local_48._0_4_ == 0) | local_48._0_4_;
      if (6 < in->ver) {
        uVar3 = local_48._0_4_;
      }
      QDateTime::QDateTime((QDateTime *)&local_48.data,local_30,(QTime)uVar3,LegacyBehavior);
    }
    else {
      operator>>(in,&local_30);
      local_48._0_4_ = 0xaaaaaaaa;
      QDataStream::operator>>(in,(qint32 *)&local_48);
      uVar3 = -(uint)(local_48._0_4_ == 0) | local_48._0_4_;
      if (6 < in->ver) {
        uVar3 = local_48._0_4_;
      }
      QDataStream::operator>>(in,(qint8 *)&local_31);
      DVar2 = local_40;
      if ((local_31 & 0xfe) == 2) {
        local_40 = (Data)0x2;
        local_48 = DVar2;
        QTimeZone::~QTimeZone((QTimeZone *)&local_48.data);
      }
      QDateTime::QDateTime
                ((QDateTime *)&local_48.data,local_30,(QTime)uVar3,(QTimeZone *)&local_40.data,
                 LegacyBehavior);
    }
  }
  else {
    operator>>(in,&local_30);
    local_48._0_4_ = 0xaaaaaaaa;
    QDataStream::operator>>(in,(qint32 *)&local_48);
    uVar3 = -(uint)(local_48._0_4_ == 0) | local_48._0_4_;
    if (6 < in->ver) {
      uVar3 = local_48._0_4_;
    }
    QDataStream::operator>>(in,(qint8 *)&local_31);
    DVar2 = local_40;
    if (local_31 == 1) {
      local_40 = (Data)0x2;
      local_48 = DVar2;
LAB_0034c558:
      QTimeZone::~QTimeZone((QTimeZone *)&local_48.data);
    }
    else {
      if (local_31 == 2) {
        local_50.d = local_50.d & 0xffffffff00000000;
        QDataStream::operator>>(in,(qint32 *)&local_50);
        lVar5 = (long)(int)local_50._0_4_;
        local_48 = local_40;
        local_40.d = (QDateTimePrivate *)0x0;
        if (lVar5 + 0xe100U < 0x1c201) {
          local_40.d = (QDateTimePrivate *)((3 - (ulong)(lVar5 == 0)) + lVar5 * 4);
        }
        goto LAB_0034c558;
      }
      if (local_31 == 3) {
        operator>>(in,(QTimeZone *)&local_40.data);
      }
    }
    QDateTime::QDateTime
              ((QDateTime *)&local_48.data,local_30,(QTime)uVar3,(QTimeZone *)&local_40.data,
               LegacyBehavior);
  }
  DVar2.data = *(ShortData *)&dateTime->d;
  dateTime->d = local_48;
  local_48.data = DVar2.data;
  QDateTime::~QDateTime((QDateTime *)&local_48.data);
LAB_0034c597:
  QTimeZone::~QTimeZone((QTimeZone *)&local_40.data);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QDateTime &dateTime)
{
    QDate dt;
    QTime tm;
    qint8 ts = 0;
    QTimeZone zone(QTimeZone::LocalTime);

    if (in.version() >= QDataStream::Qt_5_2) {

        // In 5.2 we switched to using Qt::TimeSpec and added offset and zone support
        in >> dt >> tm >> ts;
        switch (static_cast<Qt::TimeSpec>(ts)) {
        case Qt::UTC:
            zone = QTimeZone::UTC;
            break;
        case Qt::OffsetFromUTC: {
            qint32 offset = 0;
            in >> offset;
            zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            break;
        }
        case Qt::LocalTime:
            break;
        case Qt::TimeZone:
            in >> zone;
            break;
        }
        // Note: no way to resolve transition ambiguity, when relevant; use default.
        dateTime = QDateTime(dt, tm, zone);

    } else if (in.version() == QDataStream::Qt_5_0) {

        // In Qt 5.0 we incorrectly serialised all datetimes as UTC
        in >> dt >> tm >> ts;
        dateTime = QDateTime(dt, tm, QTimeZone::UTC);
        if (static_cast<Qt::TimeSpec>(ts) == Qt::LocalTime)
            dateTime = dateTime.toTimeZone(zone);

    } else if (in.version() >= QDataStream::Qt_4_0) {

        // From 4.0 to 5.1 (except 5.0) we used QDateTimePrivate::Spec
        in >> dt >> tm >> ts;
        switch (static_cast<QDateTimePrivate::Spec>(ts)) {
        case QDateTimePrivate::OffsetFromUTC: // No offset was stored, so treat as UTC.
        case QDateTimePrivate::UTC:
            zone = QTimeZone::UTC;
            break;
        case QDateTimePrivate::TimeZone: // No zone was stored, so treat as LocalTime:
        case QDateTimePrivate::LocalUnknown:
        case QDateTimePrivate::LocalStandard:
        case QDateTimePrivate::LocalDST:
            break;
        }
        dateTime = QDateTime(dt, tm, zone);

    } else { // version < QDataStream::Qt_4_0

        // Before 4.0 there was no TimeSpec, only Qt::LocalTime was supported
        in >> dt >> tm;
        dateTime = QDateTime(dt, tm);

    }

    return in;
}